

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

ps_nbest_t * ps_nbest(ps_decoder_t *ps)

{
  int iVar1;
  ps_lattice_t *dag_00;
  ps_astar_t *nbest_00;
  float32 local_34;
  float32 lwf;
  ps_astar_t *nbest;
  ngram_model_t *lmset;
  ps_lattice_t *dag;
  ps_decoder_t *ps_local;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x5c2,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    ps_local = (ps_decoder_t *)0x0;
  }
  else {
    dag_00 = ps_get_lattice(ps);
    if (dag_00 == (ps_lattice_t *)0x0) {
      ps_local = (ps_decoder_t *)0x0;
    }
    else {
      iVar1 = strcmp(ps->search->type,"ngram");
      if (iVar1 == 0) {
        nbest = (ps_astar_t *)ps->search[1].vt;
        local_34 = (float32)ps->search[3].n_words;
      }
      else {
        nbest = (ps_astar_t *)0x0;
        local_34 = 1.0;
      }
      nbest_00 = ps_astar_start(dag_00,(ngram_model_t *)nbest,local_34,0,-1,-1,-1);
      ps_local = (ps_decoder_t *)ps_nbest_next(nbest_00);
    }
  }
  return (ps_nbest_t *)ps_local;
}

Assistant:

ps_nbest_t *
ps_nbest(ps_decoder_t *ps)
{
    ps_lattice_t *dag;
    ngram_model_t *lmset;
    ps_astar_t *nbest;
    float32 lwf;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return NULL;
    }
    if ((dag = ps_get_lattice(ps)) == NULL)
        return NULL;

    /* FIXME: This is all quite specific to N-Gram search.  Either we
     * should make N-best a method for each search module or it needs
     * to be abstracted to work for N-Gram and FSG. */
    if (0 != strcmp(ps_search_type(ps->search), PS_SEARCH_TYPE_NGRAM)) {
        lmset = NULL;
        lwf = 1.0f;
    } else {
        lmset = ((ngram_search_t *)ps->search)->lmset;
        lwf = ((ngram_search_t *)ps->search)->bestpath_fwdtree_lw_ratio;
    }

    nbest = ps_astar_start(dag, lmset, lwf, 0, -1, -1, -1);

    nbest = ps_nbest_next(nbest);

    return (ps_nbest_t *)nbest;
}